

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O3

void __thiscall SelectiveBranchingMT::task_data::~task_data(task_data *this)

{
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *__ptr;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__ptr_00;
  pair<unsigned_int,_float> *__ptr_01;
  string *psVar1;
  pointer pcVar2;
  
  __ptr = (this->branches)._begin;
  if (__ptr != (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)0x0) {
    free(__ptr);
  }
  (this->branches)._begin = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)0x0;
  (this->branches)._end = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)0x0;
  (this->branches).end_array = (pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)0x0;
  __ptr_00 = (this->final)._begin;
  if (__ptr_00 !=
      (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
       *)0x0) {
    free(__ptr_00);
  }
  (this->final)._begin =
       (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        *)0x0;
  (this->final)._end =
       (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        *)0x0;
  (this->final).end_array =
       (pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        *)0x0;
  __ptr_01 = (this->trajectory)._begin;
  if (__ptr_01 != (pair<unsigned_int,_float> *)0x0) {
    free(__ptr_01);
  }
  (this->trajectory)._begin = (pair<unsigned_int,_float> *)0x0;
  (this->trajectory)._end = (pair<unsigned_int,_float> *)0x0;
  (this->trajectory).end_array = (pair<unsigned_int,_float> *)0x0;
  psVar1 = this->output_string;
  if (psVar1 != (string *)0x0) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  if (this->kbest_out != (stringstream *)0x0) {
    (**(code **)(*(long *)this->kbest_out + 8))();
    return;
  }
  return;
}

Assistant:

~task_data()
  {
    branches.delete_v();
    final.delete_v();
    trajectory.delete_v();
    if (output_string)
      delete output_string;
    if (kbest_out)
      delete kbest_out;
  }